

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall
wasm::WasmBinaryWriter::writeInlineBuffer(WasmBinaryWriter *this,char *data,size_t size)

{
  BufferWithRandomAccess *this_00;
  U32LEB local_24;
  size_t local_20;
  size_t size_local;
  char *data_local;
  WasmBinaryWriter *this_local;
  
  this_00 = this->o;
  local_20 = size;
  size_local = (size_t)data;
  data_local = (char *)this;
  LEB<unsigned_int,_unsigned_char>::LEB(&local_24,(uint)size);
  BufferWithRandomAccess::operator<<(this_00,local_24);
  writeData(this,(char *)size_local,local_20);
  return;
}

Assistant:

void WasmBinaryWriter::writeInlineBuffer(const char* data, size_t size) {
  o << U32LEB(size);
  writeData(data, size);
}